

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

int getpos(coord *cc,boolean force,char *goal)

{
  bool bVar1;
  uint local_2c;
  uint local_28;
  int y;
  int x;
  int rv;
  char *goal_local;
  coord *pcStack_10;
  boolean force_local;
  coord *cc_local;
  
  y = -1;
  local_28 = (uint)cc->x;
  local_2c = (uint)cc->y;
  _x = goal;
  goal_local._7_1_ = force;
  pcStack_10 = cc;
  flush_screen();
  do {
    y = (*windowprocs.win_getpos)((int *)&local_28,(int *)&local_2c,goal_local._7_1_,_x);
    bVar1 = false;
    if ((((goal_local._7_1_ != '\0') && (bVar1 = true, y != -1)) &&
        (bVar1 = true, 0 < (int)local_28)) &&
       ((bVar1 = true, 0 < (int)local_2c && (bVar1 = true, (int)local_28 < 0x51)))) {
      bVar1 = 0x15 < (int)local_2c;
    }
  } while (bVar1);
  log_getpos(y,local_28,local_2c);
  if (y == -1) {
    pline("<position: (cancelled)>");
  }
  else {
    pline("<position: (%d, %d)>",(ulong)local_28,(ulong)local_2c);
  }
  suppress_more();
  pcStack_10->x = (xchar)local_28;
  pcStack_10->y = (xchar)local_2c;
  return y;
}

Assistant:

int getpos(coord *cc, boolean force, const char *goal)
{
	int rv = -1, x, y;
	
	x = cc->x;
	y = cc->y;
	
	flush_screen();
	
	do {
	    rv = (*windowprocs.win_getpos)(&x, &y, force, goal);
	} while (force && (rv == -1 || x < 1 || y < 1 || x > COLNO || y > ROWNO));
	log_getpos(rv, x, y);
	if (rv == -1)
	    pline("<position: (cancelled)>");
	else
	    pline("<position: (%d, %d)>", x, y);
	suppress_more();

	cc->x = x;
	cc->y = y;
	
	return rv;
}